

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int modifyPagePointer(MemPage *pPage,Pgno iFrom,Pgno iTo,u8 eType)

{
  ushort uVar1;
  uint uVar2;
  u32 x_1;
  int iVar3;
  undefined7 in_register_00000009;
  undefined8 uVar4;
  ulong uVar5;
  uint *puVar6;
  u8 *puVar7;
  CellInfo info;
  CellInfo local_48;
  
  if ((int)CONCAT71(in_register_00000009,eType) == 4) {
    uVar2 = *(uint *)pPage->aData;
    if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) == iFrom)
    {
      *(Pgno *)pPage->aData =
           iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
      return 0;
    }
    uVar4 = 0xf2fb;
  }
  else {
    iVar3 = btreeInitPage(pPage);
    if (iVar3 != 0) {
      return iVar3;
    }
    uVar1 = pPage->nCell;
    uVar5 = 0;
    if (uVar1 == 0) {
LAB_0012a567:
      if ((uint)uVar5 != (uint)uVar1) {
        return 0;
      }
    }
    else {
      uVar5 = 0;
      do {
        puVar6 = (uint *)(pPage->aData +
                         (CONCAT11(pPage->aCellIdx[uVar5 * 2],pPage->aCellIdx[uVar5 * 2 + 1]) &
                         pPage->maskPage));
        if (eType == '\x03') {
          (*pPage->xParseCell)(pPage,(u8 *)puVar6,&local_48);
          if (local_48.nLocal < local_48.nPayload) {
            puVar7 = (u8 *)((long)puVar6 + (ulong)local_48.nSize);
            if (pPage->aData + pPage->pBt->usableSize < puVar7) {
              uVar4 = 0xf30e;
              goto LAB_0012a5bb;
            }
            uVar2 = *(uint *)(puVar7 + -4);
            if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
                iFrom) {
              *(Pgno *)(puVar7 + -4) =
                   iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
              return 0;
            }
          }
        }
        else {
          uVar2 = *puVar6;
          if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
              iFrom) {
            *puVar6 = iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
            goto LAB_0012a567;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    if (eType == '\x05') {
      uVar2 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) == iFrom
         ) {
        *(Pgno *)(pPage->aData + (ulong)pPage->hdrOffset + 8) =
             iTo >> 0x18 | (iTo & 0xff0000) >> 8 | (iTo & 0xff00) << 8 | iTo << 0x18;
        return 0;
      }
    }
    uVar4 = 0xf320;
  }
LAB_0012a5bb:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
              "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  return 0xb;
}

Assistant:

static int modifyPagePointer(MemPage *pPage, Pgno iFrom, Pgno iTo, u8 eType){
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( eType==PTRMAP_OVERFLOW2 ){
    /* The pointer is always the first 4 bytes of the page in this case.  */
    if( get4byte(pPage->aData)!=iFrom ){
      return SQLITE_CORRUPT_BKPT;
    }
    put4byte(pPage->aData, iTo);
  }else{
    int i;
    int nCell;
    int rc;

    rc = btreeInitPage(pPage);
    if( rc ) return rc;
    nCell = pPage->nCell;

    for(i=0; i<nCell; i++){
      u8 *pCell = findCell(pPage, i);
      if( eType==PTRMAP_OVERFLOW1 ){
        CellInfo info;
        pPage->xParseCell(pPage, pCell, &info);
        if( info.nLocal<info.nPayload ){
          if( pCell+info.nSize > pPage->aData+pPage->pBt->usableSize ){
            return SQLITE_CORRUPT_BKPT;
          }
          if( iFrom==get4byte(pCell+info.nSize-4) ){
            put4byte(pCell+info.nSize-4, iTo);
            break;
          }
        }
      }else{
        if( get4byte(pCell)==iFrom ){
          put4byte(pCell, iTo);
          break;
        }
      }
    }
  
    if( i==nCell ){
      if( eType!=PTRMAP_BTREE || 
          get4byte(&pPage->aData[pPage->hdrOffset+8])!=iFrom ){
        return SQLITE_CORRUPT_BKPT;
      }
      put4byte(&pPage->aData[pPage->hdrOffset+8], iTo);
    }
  }
  return SQLITE_OK;
}